

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

string * __thiscall
glcts::TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getVertexShaderCode_abi_cxx11_
          (string *__return_storage_ptr__,
          TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this,
          bool should_pass_pointsize_data)

{
  stringstream local_1a8 [8];
  stringstream result_sstream;
  ostream local_198;
  byte local_19;
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *pTStack_18;
  bool should_pass_pointsize_data_local;
  TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *this_local;
  
  local_19 = should_pass_pointsize_data;
  pTStack_18 = this;
  this_local = (TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize *)
               __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::operator<<(&local_198,"${VERSION}\n\n");
  if ((local_19 & 1) == 0) {
    std::operator<<(&local_198,"${OUT_PER_VERTEX_DECL}");
  }
  else {
    std::operator<<(&local_198,"${OUT_PER_VERTEX_DECL_POINT_SIZE}");
  }
  std::operator<<(&local_198,"\nvoid main()\n{\n}\n");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderTCTEgl_MaxPatchVertices_Position_PointSize::getVertexShaderCode(
	bool should_pass_pointsize_data)
{
	std::stringstream result_sstream;
	result_sstream << "${VERSION}\n\n";
	if (should_pass_pointsize_data)
	{
		result_sstream << "${OUT_PER_VERTEX_DECL_POINT_SIZE}";
	}
	else
	{
		result_sstream << "${OUT_PER_VERTEX_DECL}";
	}
	result_sstream << "\n"
					  "void main()\n"
					  "{\n"
					  "}\n";

	return result_sstream.str();
}